

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O0

Slice __thiscall leveldb::BlockBuilder::Finish(BlockBuilder *this)

{
  size_type sVar1;
  reference pvVar2;
  ulong local_28;
  size_t i;
  BlockBuilder *this_local;
  
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->restarts_);
    if (sVar1 <= local_28) break;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->restarts_,local_28);
    PutFixed32(&this->buffer_,*pvVar2);
    local_28 = local_28 + 1;
  }
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->restarts_);
  PutFixed32(&this->buffer_,(uint32_t)sVar1);
  this->finished_ = true;
  Slice::Slice((Slice *)&this_local,&this->buffer_);
  return _this_local;
}

Assistant:

Slice BlockBuilder::Finish() {
  // Append restart array
  for (size_t i = 0; i < restarts_.size(); i++) {
    PutFixed32(&buffer_, restarts_[i]);
  }
  PutFixed32(&buffer_, restarts_.size());
  finished_ = true;
  return Slice(buffer_);
}